

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar1;
  uint uVar2;
  BVH *bvh;
  size_t sVar3;
  Scene *pSVar4;
  float *pfVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  byte bVar18;
  byte bVar19;
  int iVar20;
  ushort uVar21;
  byte bVar22;
  byte bVar23;
  NodeRef root;
  size_t sVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  NodeRef *pNVar29;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar30;
  undefined4 uVar31;
  ulong uVar32;
  bool bVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar95;
  undefined1 auVar91 [16];
  float fVar93;
  float fVar94;
  undefined1 auVar92 [64];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  Precalculations pre;
  undefined1 local_1938 [16];
  RayK<4> *local_1928;
  RayK<4> *local_1920;
  RTCFilterFunctionNArguments args;
  RTCHitN local_18c8 [16];
  undefined1 local_18b8 [16];
  undefined1 local_18a8 [16];
  undefined1 local_1898 [16];
  undefined1 local_1888 [16];
  undefined1 local_1878 [16];
  undefined1 local_1868 [16];
  uint local_1858;
  uint uStack_1854;
  uint uStack_1850;
  uint uStack_184c;
  uint uStack_1848;
  uint uStack_1844;
  uint uStack_1840;
  uint uStack_183c;
  TravRayK<4,_true> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar36 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar41 = ZEXT816(0) << 0x40;
    uVar11 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar41,5);
    uVar35 = vpcmpeqd_avx512vl(auVar36,(undefined1  [16])valid_i->field_0);
    uVar35 = ((byte)uVar11 & 0xf) & uVar35;
    bVar19 = (byte)uVar35;
    if (bVar19 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar102 = ZEXT1664(auVar36);
      auVar37 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar36);
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar103 = ZEXT1664(auVar38);
      uVar28 = vcmpps_avx512vl(auVar37,auVar38,1);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar104 = ZEXT1664(auVar37);
      auVar39 = vdivps_avx512vl(auVar37,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar40 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar36);
      uVar32 = vcmpps_avx512vl(auVar40,auVar38,1);
      auVar40 = vdivps_avx512vl(auVar37,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar36 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar36);
      uVar34 = vcmpps_avx512vl(auVar36,auVar38,1);
      auVar36 = vdivps_avx512vl(auVar37,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      bVar33 = (bool)((byte)uVar28 & 1);
      tray.rdir.field_0._0_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar39._0_4_;
      bVar33 = (bool)((byte)(uVar28 >> 1) & 1);
      tray.rdir.field_0._4_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar39._4_4_;
      bVar33 = (bool)((byte)(uVar28 >> 2) & 1);
      tray.rdir.field_0._8_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar39._8_4_;
      bVar33 = (bool)((byte)(uVar28 >> 3) & 1);
      tray.rdir.field_0._12_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar39._12_4_;
      bVar33 = (bool)((byte)uVar32 & 1);
      tray.rdir.field_0._16_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar40._0_4_;
      bVar33 = (bool)((byte)(uVar32 >> 1) & 1);
      tray.rdir.field_0._20_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar40._4_4_;
      bVar33 = (bool)((byte)(uVar32 >> 2) & 1);
      tray.rdir.field_0._24_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar40._8_4_;
      bVar33 = (bool)((byte)(uVar32 >> 3) & 1);
      tray.rdir.field_0._28_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar40._12_4_;
      bVar33 = (bool)((byte)uVar34 & 1);
      tray.rdir.field_0._32_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar36._0_4_;
      bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
      tray.rdir.field_0._36_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar36._4_4_;
      bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
      tray.rdir.field_0._40_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar36._8_4_;
      bVar33 = (bool)((byte)(uVar34 >> 3) & 1);
      tray.rdir.field_0._44_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar36._12_4_;
      uVar28 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar41,1);
      auVar36 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar28 & 1) * auVar36._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar36._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar36._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar36._12_4_;
      uVar28 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar41,5);
      auVar36 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar33 = (bool)((byte)uVar28 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar33 * auVar36._0_4_ | (uint)!bVar33 * 0x30;
      bVar33 = (bool)((byte)(uVar28 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar33 * auVar36._4_4_ | (uint)!bVar33 * 0x30;
      bVar33 = (bool)((byte)(uVar28 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar33 * auVar36._8_4_ | (uint)!bVar33 * 0x30;
      bVar33 = (bool)((byte)(uVar28 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar33 * auVar36._12_4_ | (uint)!bVar33 * 0x30;
      uVar28 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar41,5);
      auVar36 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar33 = (bool)((byte)uVar28 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar33 * auVar36._0_4_ | (uint)!bVar33 * 0x50;
      bVar33 = (bool)((byte)(uVar28 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar33 * auVar36._4_4_ | (uint)!bVar33 * 0x50;
      bVar33 = (bool)((byte)(uVar28 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar33 * auVar36._8_4_ | (uint)!bVar33 * 0x50;
      bVar33 = (bool)((byte)(uVar28 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar33 * auVar36._12_4_ | (uint)!bVar33 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar106 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar36 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar41);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar19 & 1) * auVar36._0_4_ |
           (uint)!(bool)(bVar19 & 1) * stack_near[0].field_0._0_4_;
      bVar33 = (bool)((byte)(uVar35 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar33 * auVar36._4_4_ | (uint)!bVar33 * stack_near[0].field_0._4_4_;
      bVar33 = (bool)((byte)(uVar35 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar33 * auVar36._8_4_ | (uint)!bVar33 * stack_near[0].field_0._8_4_;
      bVar33 = SUB81(uVar35 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar33 * auVar36._12_4_ | (uint)!bVar33 * stack_near[0].field_0._12_4_;
      auVar36 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar105 = ZEXT1664(auVar36);
      auVar41 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar41);
      tray.tfar.field_0.i[0] =
           (uint)(bVar19 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar36._0_4_;
      bVar33 = (bool)((byte)(uVar35 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar33 * auVar41._4_4_ | (uint)!bVar33 * auVar36._4_4_;
      bVar33 = (bool)((byte)(uVar35 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar33 * auVar41._8_4_ | (uint)!bVar33 * auVar36._8_4_;
      bVar33 = SUB81(uVar35 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar33 * auVar41._12_4_ | (uint)!bVar33 * auVar36._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar26 = 3;
      }
      else {
        uVar26 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1928 = ray + 0x80;
      uVar21 = (ushort)uVar35 ^ 0xf;
      pNVar29 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar30 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar107 = ZEXT1664(auVar36);
      auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar101 = ZEXT1664(auVar36);
      auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar100 = ZEXT1664(auVar36);
LAB_0073efcb:
      paVar30 = paVar30 + -1;
      root.ptr = pNVar29[-1].ptr;
      pNVar29 = pNVar29 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_0073ff88;
      aVar1 = *paVar30;
      uVar35 = vcmpps_avx512vl((undefined1  [16])aVar1,(undefined1  [16])tray.tfar.field_0,1);
      if ((char)uVar35 == '\0') {
LAB_0073ffbd:
        iVar20 = 2;
      }
      else {
        uVar31 = (undefined4)uVar35;
        iVar20 = 0;
        if ((uint)POPCOUNT(uVar31) <= uVar26) {
          do {
            sVar24 = 0;
            for (uVar28 = uVar35; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
              sVar24 = sVar24 + 1;
            }
            bVar33 = occluded1(This,bvh,root,sVar24,&pre,ray,&tray,context);
            bVar18 = (byte)(1 << ((uint)sVar24 & 0x1f));
            if (!bVar33) {
              bVar18 = 0;
            }
            bVar18 = (byte)uVar21 | bVar18;
            uVar21 = (ushort)bVar18;
            uVar35 = uVar35 - 1 & uVar35;
          } while (uVar35 != 0);
          if (bVar18 == 0xf) {
            iVar20 = 3;
          }
          else {
            auVar36 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)(bVar18 & 1) * auVar36._0_4_ |
                 (uint)!(bool)(bVar18 & 1) * tray.tfar.field_0.i[0];
            bVar33 = (bool)(bVar18 >> 1 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar33 * auVar36._4_4_ | (uint)!bVar33 * tray.tfar.field_0.i[1];
            bVar33 = (bool)(bVar18 >> 2 & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar33 * auVar36._8_4_ | (uint)!bVar33 * tray.tfar.field_0.i[2];
            bVar33 = (bool)(bVar18 >> 3 & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar33 * auVar36._12_4_ | (uint)!bVar33 * tray.tfar.field_0.i[3];
            iVar20 = 2;
          }
          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar102 = ZEXT1664(auVar36);
          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          auVar103 = ZEXT1664(auVar36);
          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar104 = ZEXT1664(auVar36);
          auVar36 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          auVar105 = ZEXT1664(auVar36);
          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar106 = ZEXT1664(auVar36);
          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar107 = ZEXT1664(auVar36);
          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar101 = ZEXT1664(auVar36);
          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar100 = ZEXT1664(auVar36);
        }
        auVar92 = ZEXT1664((undefined1  [16])aVar1);
        if (uVar26 < (uint)POPCOUNT(uVar31)) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0073ff88;
              uVar11 = vcmpps_avx512vl(auVar92._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar11 == '\0') goto LAB_0073ffbd;
              uVar35 = (ulong)((uint)root.ptr & 0xf);
              bVar18 = (byte)uVar21 & 0xf;
              if (uVar35 == 8) goto LAB_0073ff78;
              bVar18 = bVar18 ^ 0xf;
              lVar25 = (root.ptr & 0xfffffffffffffff0) + 0x50;
              uVar28 = 0;
              local_1920 = ray;
              goto LAB_0073f202;
            }
            auVar92 = ZEXT1664(auVar106._0_16_);
            uVar35 = 0;
            sVar24 = 8;
            do {
              sVar3 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + uVar35 * 8);
              if (sVar3 != 8) {
                uVar31 = *(undefined4 *)(root.ptr + 0x20 + uVar35 * 4);
                auVar70._4_4_ = uVar31;
                auVar70._0_4_ = uVar31;
                auVar70._8_4_ = uVar31;
                auVar70._12_4_ = uVar31;
                auVar15._8_8_ = tray.org.field_0._8_8_;
                auVar15._0_8_ = tray.org.field_0._0_8_;
                auVar16._8_8_ = tray.org.field_0._24_8_;
                auVar16._0_8_ = tray.org.field_0._16_8_;
                auVar17._8_8_ = tray.org.field_0._40_8_;
                auVar17._0_8_ = tray.org.field_0._32_8_;
                auVar36 = vsubps_avx(auVar70,auVar15);
                auVar85._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar36._0_4_;
                auVar85._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar36._4_4_;
                auVar85._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar36._8_4_;
                auVar85._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar36._12_4_;
                uVar31 = *(undefined4 *)(root.ptr + 0x40 + uVar35 * 4);
                auVar71._4_4_ = uVar31;
                auVar71._0_4_ = uVar31;
                auVar71._8_4_ = uVar31;
                auVar71._12_4_ = uVar31;
                auVar36 = vsubps_avx(auVar71,auVar16);
                auVar86._0_4_ = tray.rdir.field_0._16_4_ * auVar36._0_4_;
                auVar86._4_4_ = tray.rdir.field_0._20_4_ * auVar36._4_4_;
                auVar86._8_4_ = tray.rdir.field_0._24_4_ * auVar36._8_4_;
                auVar86._12_4_ = tray.rdir.field_0._28_4_ * auVar36._12_4_;
                uVar31 = *(undefined4 *)(root.ptr + 0x60 + uVar35 * 4);
                auVar72._4_4_ = uVar31;
                auVar72._0_4_ = uVar31;
                auVar72._8_4_ = uVar31;
                auVar72._12_4_ = uVar31;
                auVar36 = vsubps_avx(auVar72,auVar17);
                auVar89._0_4_ = tray.rdir.field_0._32_4_ * auVar36._0_4_;
                auVar89._4_4_ = tray.rdir.field_0._36_4_ * auVar36._4_4_;
                auVar89._8_4_ = tray.rdir.field_0._40_4_ * auVar36._8_4_;
                auVar89._12_4_ = tray.rdir.field_0._44_4_ * auVar36._12_4_;
                uVar31 = *(undefined4 *)(root.ptr + 0x30 + uVar35 * 4);
                auVar73._4_4_ = uVar31;
                auVar73._0_4_ = uVar31;
                auVar73._8_4_ = uVar31;
                auVar73._12_4_ = uVar31;
                auVar36 = vsubps_avx(auVar73,auVar15);
                auVar76._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar36._0_4_;
                auVar76._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar36._4_4_;
                auVar76._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar36._8_4_;
                auVar76._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar36._12_4_;
                uVar31 = *(undefined4 *)(root.ptr + 0x50 + uVar35 * 4);
                auVar74._4_4_ = uVar31;
                auVar74._0_4_ = uVar31;
                auVar74._8_4_ = uVar31;
                auVar74._12_4_ = uVar31;
                auVar36 = vsubps_avx(auVar74,auVar16);
                auVar77._0_4_ = tray.rdir.field_0._16_4_ * auVar36._0_4_;
                auVar77._4_4_ = tray.rdir.field_0._20_4_ * auVar36._4_4_;
                auVar77._8_4_ = tray.rdir.field_0._24_4_ * auVar36._8_4_;
                auVar77._12_4_ = tray.rdir.field_0._28_4_ * auVar36._12_4_;
                uVar31 = *(undefined4 *)(root.ptr + 0x70 + uVar35 * 4);
                auVar75._4_4_ = uVar31;
                auVar75._0_4_ = uVar31;
                auVar75._8_4_ = uVar31;
                auVar75._12_4_ = uVar31;
                auVar36 = vsubps_avx(auVar75,auVar17);
                auVar79._0_4_ = tray.rdir.field_0._32_4_ * auVar36._0_4_;
                auVar79._4_4_ = tray.rdir.field_0._36_4_ * auVar36._4_4_;
                auVar79._8_4_ = tray.rdir.field_0._40_4_ * auVar36._8_4_;
                auVar79._12_4_ = tray.rdir.field_0._44_4_ * auVar36._12_4_;
                auVar36 = vminps_avx(auVar85,auVar76);
                auVar41 = vminps_avx(auVar86,auVar77);
                auVar36 = vmaxps_avx(auVar36,auVar41);
                auVar41 = vminps_avx(auVar89,auVar79);
                auVar36 = vmaxps_avx(auVar36,auVar41);
                auVar37 = vmulps_avx512vl(auVar36,auVar107._0_16_);
                auVar36 = vmaxps_avx(auVar85,auVar76);
                auVar41 = vmaxps_avx(auVar86,auVar77);
                auVar41 = vminps_avx(auVar36,auVar41);
                auVar36 = vmaxps_avx(auVar89,auVar79);
                auVar36 = vminps_avx(auVar41,auVar36);
                auVar41 = vmulps_avx512vl(auVar36,auVar101._0_16_);
                auVar36 = vmaxps_avx(auVar37,(undefined1  [16])tray.tnear.field_0);
                auVar41 = vminps_avx(auVar41,(undefined1  [16])tray.tfar.field_0);
                uVar28 = vcmpps_avx512vl(auVar36,auVar41,2);
                if ((byte)uVar28 != 0) {
                  auVar36 = vblendmps_avx512vl(auVar106._0_16_,auVar37);
                  bVar33 = (bool)((byte)uVar28 & 1);
                  bVar8 = (bool)((byte)(uVar28 >> 1) & 1);
                  bVar9 = (bool)((byte)(uVar28 >> 2) & 1);
                  bVar10 = (bool)((byte)(uVar28 >> 3) & 1);
                  if (sVar24 != 8) {
                    pNVar29->ptr = sVar24;
                    pNVar29 = pNVar29 + 1;
                    *paVar30 = auVar92._0_16_;
                    paVar30 = paVar30 + 1;
                  }
                  auVar92 = ZEXT1664(CONCAT412((uint)bVar10 * auVar36._12_4_ |
                                               (uint)!bVar10 * auVar37._12_4_,
                                               CONCAT48((uint)bVar9 * auVar36._8_4_ |
                                                        (uint)!bVar9 * auVar37._8_4_,
                                                        CONCAT44((uint)bVar8 * auVar36._4_4_ |
                                                                 (uint)!bVar8 * auVar37._4_4_,
                                                                 (uint)bVar33 * auVar36._0_4_ |
                                                                 (uint)!bVar33 * auVar37._0_4_))));
                  sVar24 = sVar3;
                }
              }
            } while ((sVar3 != 8) && (bVar33 = uVar35 < 3, uVar35 = uVar35 + 1, bVar33));
            iVar20 = 0;
            if (sVar24 == 8) {
LAB_0073f1b0:
              bVar33 = false;
              iVar20 = 4;
            }
            else {
              uVar11 = vcmpps_avx512vl((undefined1  [16])auVar92._0_16_,
                                       (undefined1  [16])tray.tfar.field_0,9);
              bVar33 = true;
              if ((uint)POPCOUNT((int)uVar11) <= uVar26) {
                pNVar29->ptr = sVar24;
                pNVar29 = pNVar29 + 1;
                *paVar30 = auVar92._0_16_;
                paVar30 = paVar30 + 1;
                goto LAB_0073f1b0;
              }
            }
            root.ptr = sVar24;
          } while (bVar33);
        }
      }
      goto LAB_0073ffaf;
    }
  }
  return;
  while( true ) {
    uVar28 = uVar28 + 1;
    lVar25 = lVar25 + 0x60;
    if (uVar35 - 8 <= uVar28) break;
LAB_0073f202:
    pSVar4 = context->scene;
    uVar32 = 0;
    bVar23 = bVar18;
    while (*(int *)(lVar25 + uVar32 * 4) != -1) {
      uVar2 = *(uint *)(lVar25 + -0x10 + uVar32 * 4);
      pfVar5 = (pSVar4->vertices).items[uVar2];
      uVar34 = (ulong)*(uint *)(lVar25 + -0x50 + uVar32 * 4);
      uVar27 = (ulong)*(uint *)(lVar25 + -0x40 + uVar32 * 4);
      fVar90 = pfVar5[uVar34];
      auVar67._4_4_ = fVar90;
      auVar67._0_4_ = fVar90;
      auVar67._8_4_ = fVar90;
      auVar67._12_4_ = fVar90;
      fVar90 = pfVar5[uVar34 + 1];
      auVar64._4_4_ = fVar90;
      auVar64._0_4_ = fVar90;
      auVar64._8_4_ = fVar90;
      auVar64._12_4_ = fVar90;
      fVar90 = pfVar5[uVar34 + 2];
      auVar78._4_4_ = fVar90;
      auVar78._0_4_ = fVar90;
      auVar78._8_4_ = fVar90;
      auVar78._12_4_ = fVar90;
      fVar90 = pfVar5[uVar27];
      auVar97._4_4_ = fVar90;
      auVar97._0_4_ = fVar90;
      auVar97._8_4_ = fVar90;
      auVar97._12_4_ = fVar90;
      fVar90 = pfVar5[uVar27 + 1];
      auVar98._4_4_ = fVar90;
      auVar98._0_4_ = fVar90;
      auVar98._8_4_ = fVar90;
      auVar98._12_4_ = fVar90;
      fVar90 = pfVar5[uVar27 + 2];
      auVar99._4_4_ = fVar90;
      auVar99._0_4_ = fVar90;
      auVar99._8_4_ = fVar90;
      auVar99._12_4_ = fVar90;
      uVar34 = (ulong)*(uint *)(lVar25 + -0x20 + uVar32 * 4);
      auVar42 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar5[uVar34]));
      auVar43 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar5[uVar34 + 1]));
      auVar44 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar5[uVar34 + 2]));
      auVar36 = *(undefined1 (*) [16])ray;
      auVar41 = *(undefined1 (*) [16])(ray + 0x10);
      auVar37 = *(undefined1 (*) [16])(ray + 0x20);
      auVar38 = *(undefined1 (*) [16])(ray + 0x40);
      auVar39 = *(undefined1 (*) [16])(ray + 0x50);
      auVar40 = *(undefined1 (*) [16])(ray + 0x60);
      auVar67 = vsubps_avx(auVar67,auVar36);
      auVar64 = vsubps_avx(auVar64,auVar41);
      auVar78 = vsubps_avx(auVar78,auVar37);
      auVar58 = vsubps_avx(auVar97,auVar36);
      auVar59 = vsubps_avx(auVar98,auVar41);
      auVar45 = vsubps_avx512vl(auVar99,auVar37);
      auVar46 = vsubps_avx512vl(auVar42,auVar36);
      auVar47 = vsubps_avx512vl(auVar43,auVar41);
      auVar48 = vsubps_avx512vl(auVar44,auVar37);
      auVar49 = vsubps_avx512vl(auVar46,auVar67);
      auVar50 = vsubps_avx512vl(auVar47,auVar64);
      auVar51 = vsubps_avx512vl(auVar48,auVar78);
      auVar52 = vsubps_avx512vl(auVar67,auVar58);
      auVar53 = vsubps_avx512vl(auVar64,auVar59);
      auVar54 = vsubps_avx512vl(auVar78,auVar45);
      auVar37 = vaddps_avx512vl(auVar46,auVar67);
      auVar55 = vaddps_avx512vl(auVar47,auVar64);
      auVar36 = vaddps_avx512vl(auVar48,auVar78);
      auVar41._0_4_ = auVar51._0_4_ * auVar55._0_4_;
      auVar41._4_4_ = auVar51._4_4_ * auVar55._4_4_;
      auVar41._8_4_ = auVar51._8_4_ * auVar55._8_4_;
      auVar41._12_4_ = auVar51._12_4_ * auVar55._12_4_;
      auVar41 = vfmsub231ps_fma(auVar41,auVar50,auVar36);
      auVar60._0_4_ = auVar49._0_4_ * auVar36._0_4_;
      auVar60._4_4_ = auVar49._4_4_ * auVar36._4_4_;
      auVar60._8_4_ = auVar49._8_4_ * auVar36._8_4_;
      auVar60._12_4_ = auVar49._12_4_ * auVar36._12_4_;
      auVar36 = vfmsub231ps_fma(auVar60,auVar51,auVar37);
      auVar56._0_4_ = auVar50._0_4_ * auVar37._0_4_;
      auVar56._4_4_ = auVar50._4_4_ * auVar37._4_4_;
      auVar56._8_4_ = auVar50._8_4_ * auVar37._8_4_;
      auVar56._12_4_ = auVar50._12_4_ * auVar37._12_4_;
      auVar37 = vfmsub231ps_fma(auVar56,auVar49,auVar55);
      fVar90 = auVar40._0_4_;
      auVar55._0_4_ = fVar90 * auVar37._0_4_;
      fVar93 = auVar40._4_4_;
      auVar55._4_4_ = fVar93 * auVar37._4_4_;
      fVar94 = auVar40._8_4_;
      auVar55._8_4_ = fVar94 * auVar37._8_4_;
      fVar95 = auVar40._12_4_;
      auVar55._12_4_ = fVar95 * auVar37._12_4_;
      auVar36 = vfmadd231ps_fma(auVar55,auVar39,auVar36);
      auVar36 = vfmadd231ps_fma(auVar36,auVar38,auVar41);
      auVar57._0_4_ = auVar58._0_4_ + auVar67._0_4_;
      auVar57._4_4_ = auVar58._4_4_ + auVar67._4_4_;
      auVar57._8_4_ = auVar58._8_4_ + auVar67._8_4_;
      auVar57._12_4_ = auVar58._12_4_ + auVar67._12_4_;
      auVar61._0_4_ = auVar59._0_4_ + auVar64._0_4_;
      auVar61._4_4_ = auVar59._4_4_ + auVar64._4_4_;
      auVar61._8_4_ = auVar59._8_4_ + auVar64._8_4_;
      auVar61._12_4_ = auVar59._12_4_ + auVar64._12_4_;
      auVar41 = vaddps_avx512vl(auVar78,auVar45);
      auVar37 = vmulps_avx512vl(auVar61,auVar54);
      auVar37 = vfmsub231ps_avx512vl(auVar37,auVar53,auVar41);
      auVar41 = vmulps_avx512vl(auVar41,auVar52);
      auVar41 = vfmsub231ps_avx512vl(auVar41,auVar54,auVar57);
      auVar55 = vmulps_avx512vl(auVar57,auVar53);
      auVar55 = vfmsub231ps_avx512vl(auVar55,auVar52,auVar61);
      auVar56 = vsubps_avx512vl(auVar58,auVar46);
      auVar62._0_4_ = fVar90 * auVar55._0_4_;
      auVar62._4_4_ = fVar93 * auVar55._4_4_;
      auVar62._8_4_ = fVar94 * auVar55._8_4_;
      auVar62._12_4_ = fVar95 * auVar55._12_4_;
      auVar41 = vfmadd231ps_avx512vl(auVar62,auVar39,auVar41);
      auVar55 = vsubps_avx512vl(auVar59,auVar47);
      auVar41 = vfmadd231ps_fma(auVar41,auVar38,auVar37);
      auVar57 = vsubps_avx512vl(auVar45,auVar48);
      auVar37 = vaddps_avx512vl(auVar58,auVar46);
      auVar58 = vaddps_avx512vl(auVar59,auVar47);
      auVar59 = vaddps_avx512vl(auVar45,auVar48);
      auVar45 = vmulps_avx512vl(auVar58,auVar57);
      auVar45 = vfmsub231ps_avx512vl(auVar45,auVar55,auVar59);
      auVar59 = vmulps_avx512vl(auVar59,auVar56);
      auVar59 = vfmsub231ps_avx512vl(auVar59,auVar57,auVar37);
      auVar46._0_4_ = auVar37._0_4_ * auVar55._0_4_;
      auVar46._4_4_ = auVar37._4_4_ * auVar55._4_4_;
      auVar46._8_4_ = auVar37._8_4_ * auVar55._8_4_;
      auVar46._12_4_ = auVar37._12_4_ * auVar55._12_4_;
      auVar37 = vfmsub231ps_fma(auVar46,auVar56,auVar58);
      auVar37 = vmulps_avx512vl(auVar37,auVar40);
      auVar37 = vfmadd231ps_avx512vl(auVar37,auVar39,auVar59);
      auVar40 = vfmadd231ps_avx512vl(auVar37,auVar38,auVar45);
      auVar58._0_4_ = auVar36._0_4_ + auVar41._0_4_;
      auVar58._4_4_ = auVar36._4_4_ + auVar41._4_4_;
      auVar58._8_4_ = auVar36._8_4_ + auVar41._8_4_;
      auVar58._12_4_ = auVar36._12_4_ + auVar41._12_4_;
      auVar58 = vaddps_avx512vl(auVar40,auVar58);
      auVar47 = auVar102._0_16_;
      auVar59 = vandps_avx512vl(auVar58,auVar47);
      auVar37._8_4_ = 0x34000000;
      auVar37._0_8_ = 0x3400000034000000;
      auVar37._12_4_ = 0x34000000;
      auVar37 = vmulps_avx512vl(auVar59,auVar37);
      auVar45 = vminps_avx512vl(auVar36,auVar41);
      auVar45 = vminps_avx512vl(auVar45,auVar40);
      auVar46 = vxorps_avx512vl(auVar37,auVar100._0_16_);
      uVar11 = vcmpps_avx512vl(auVar45,auVar46,5);
      uVar34 = (ulong)*(uint *)(lVar25 + -0x30 + uVar32 * 4);
      auVar45 = vmaxps_avx512vl(auVar36,auVar41);
      auVar40 = vmaxps_avx512vl(auVar45,auVar40);
      auVar45 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar5[uVar34]));
      uVar12 = vcmpps_avx512vl(auVar40,auVar37,2);
      auVar37 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar5[uVar34 + 1]));
      auVar40 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar5[uVar34 + 2]));
      bVar22 = ((byte)uVar11 | (byte)uVar12) & 0xf & bVar23;
      if (bVar22 != 0) {
        auVar46 = vmulps_avx512vl(auVar53,auVar51);
        auVar48 = vmulps_avx512vl(auVar49,auVar54);
        auVar60 = vmulps_avx512vl(auVar52,auVar50);
        auVar61 = vmulps_avx512vl(auVar55,auVar54);
        auVar62 = vmulps_avx512vl(auVar52,auVar57);
        auVar63 = vmulps_avx512vl(auVar56,auVar53);
        auVar50 = vfmsub213ps_avx512vl(auVar50,auVar54,auVar46);
        auVar51 = vfmsub213ps_avx512vl(auVar51,auVar52,auVar48);
        auVar49 = vfmsub213ps_avx512vl(auVar49,auVar53,auVar60);
        auVar53 = vfmsub213ps_avx512vl(auVar57,auVar53,auVar61);
        auVar54 = vfmsub213ps_avx512vl(auVar56,auVar54,auVar62);
        auVar52 = vfmsub213ps_avx512vl(auVar55,auVar52,auVar63);
        auVar46 = vandps_avx512vl(auVar46,auVar47);
        auVar55 = vandps_avx512vl(auVar61,auVar47);
        uVar34 = vcmpps_avx512vl(auVar46,auVar55,1);
        auVar46 = vandps_avx512vl(auVar48,auVar47);
        auVar48 = vandps_avx512vl(auVar62,auVar47);
        uVar27 = vcmpps_avx512vl(auVar46,auVar48,1);
        auVar46 = vandps_avx512vl(auVar60,auVar47);
        auVar47 = vandps_avx512vl(auVar63,auVar47);
        auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar100 = ZEXT1664(auVar48);
        uVar13 = vcmpps_avx512vl(auVar46,auVar47,1);
        bVar33 = (bool)((byte)uVar34 & 1);
        auVar47._0_4_ = (uint)bVar33 * auVar50._0_4_ | (uint)!bVar33 * auVar53._0_4_;
        bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
        auVar47._4_4_ = (uint)bVar33 * auVar50._4_4_ | (uint)!bVar33 * auVar53._4_4_;
        bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
        auVar47._8_4_ = (uint)bVar33 * auVar50._8_4_ | (uint)!bVar33 * auVar53._8_4_;
        bVar33 = (bool)((byte)(uVar34 >> 3) & 1);
        auVar47._12_4_ = (uint)bVar33 * auVar50._12_4_ | (uint)!bVar33 * auVar53._12_4_;
        bVar33 = (bool)((byte)uVar27 & 1);
        auVar50._0_4_ = (uint)bVar33 * auVar51._0_4_ | (uint)!bVar33 * auVar54._0_4_;
        bVar33 = (bool)((byte)(uVar27 >> 1) & 1);
        auVar50._4_4_ = (uint)bVar33 * auVar51._4_4_ | (uint)!bVar33 * auVar54._4_4_;
        bVar33 = (bool)((byte)(uVar27 >> 2) & 1);
        auVar50._8_4_ = (uint)bVar33 * auVar51._8_4_ | (uint)!bVar33 * auVar54._8_4_;
        bVar33 = (bool)((byte)(uVar27 >> 3) & 1);
        auVar50._12_4_ = (uint)bVar33 * auVar51._12_4_ | (uint)!bVar33 * auVar54._12_4_;
        bVar33 = (bool)((byte)uVar13 & 1);
        auVar51._0_4_ = (float)((uint)bVar33 * auVar49._0_4_ | (uint)!bVar33 * auVar52._0_4_);
        bVar33 = (bool)((byte)(uVar13 >> 1) & 1);
        auVar51._4_4_ = (float)((uint)bVar33 * auVar49._4_4_ | (uint)!bVar33 * auVar52._4_4_);
        bVar33 = (bool)((byte)(uVar13 >> 2) & 1);
        auVar51._8_4_ = (float)((uint)bVar33 * auVar49._8_4_ | (uint)!bVar33 * auVar52._8_4_);
        bVar33 = (bool)((byte)(uVar13 >> 3) & 1);
        auVar51._12_4_ = (float)((uint)bVar33 * auVar49._12_4_ | (uint)!bVar33 * auVar52._12_4_);
        auVar52._0_4_ = fVar90 * auVar51._0_4_;
        auVar52._4_4_ = fVar93 * auVar51._4_4_;
        auVar52._8_4_ = fVar94 * auVar51._8_4_;
        auVar52._12_4_ = fVar95 * auVar51._12_4_;
        auVar39 = vfmadd213ps_fma(auVar39,auVar50,auVar52);
        auVar38 = vfmadd213ps_fma(auVar38,auVar47,auVar39);
        auVar49._0_4_ = auVar38._0_4_ + auVar38._0_4_;
        auVar49._4_4_ = auVar38._4_4_ + auVar38._4_4_;
        auVar49._8_4_ = auVar38._8_4_ + auVar38._8_4_;
        auVar49._12_4_ = auVar38._12_4_ + auVar38._12_4_;
        auVar38._0_4_ = auVar78._0_4_ * auVar51._0_4_;
        auVar38._4_4_ = auVar78._4_4_ * auVar51._4_4_;
        auVar38._8_4_ = auVar78._8_4_ * auVar51._8_4_;
        auVar38._12_4_ = auVar78._12_4_ * auVar51._12_4_;
        auVar38 = vfmadd213ps_fma(auVar64,auVar50,auVar38);
        auVar67 = vfmadd213ps_fma(auVar67,auVar47,auVar38);
        auVar38 = vrcp14ps_avx512vl(auVar49);
        auVar64 = vxorps_avx512vl(auVar49,auVar48);
        auVar78 = auVar104._0_16_;
        auVar39 = vfnmadd213ps_avx512vl(auVar38,auVar49,auVar78);
        auVar39 = vfmadd132ps_fma(auVar39,auVar38,auVar38);
        auVar38 = *(undefined1 (*) [16])(ray + 0x80);
        auVar48._0_4_ = auVar39._0_4_ * (auVar67._0_4_ + auVar67._0_4_);
        auVar48._4_4_ = auVar39._4_4_ * (auVar67._4_4_ + auVar67._4_4_);
        auVar48._8_4_ = auVar39._8_4_ * (auVar67._8_4_ + auVar67._8_4_);
        auVar48._12_4_ = auVar39._12_4_ * (auVar67._12_4_ + auVar67._12_4_);
        uVar11 = vcmpps_avx512vl(auVar48,auVar38,2);
        uVar12 = vcmpps_avx512vl(auVar48,*(undefined1 (*) [16])(ray + 0x30),0xd);
        uVar14 = vcmpps_avx512vl(auVar49,auVar64,4);
        bVar22 = bVar22 & (byte)uVar11 & (byte)uVar12 & (byte)uVar14;
        if (bVar22 != 0) {
          pGVar6 = (context->scene->geometries).items[uVar2].ptr;
          uVar2 = pGVar6->mask;
          auVar39._4_4_ = uVar2;
          auVar39._0_4_ = uVar2;
          auVar39._8_4_ = uVar2;
          auVar39._12_4_ = uVar2;
          uVar11 = vptestmd_avx512vl(auVar39,*(undefined1 (*) [16])(ray + 0x90));
          bVar22 = bVar22 & (byte)uVar11 & 0xf;
          uVar34 = (ulong)bVar22;
          ray = local_1920;
          if (bVar22 != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              uVar34 = vcmpps_avx512vl(auVar59,auVar103._0_16_,5);
              auVar39 = vrcp14ps_avx512vl(auVar58);
              auVar67 = vfnmadd213ps_avx512vl(auVar58,auVar39,auVar78);
              auVar39 = vfmadd132ps_avx512vl(auVar67,auVar39,auVar39);
              fVar95 = (float)((uint)((byte)uVar34 & 1) * auVar39._0_4_);
              fVar90 = (float)((uint)((byte)(uVar34 >> 1) & 1) * auVar39._4_4_);
              fVar94 = (float)((uint)((byte)(uVar34 >> 2) & 1) * auVar39._8_4_);
              fVar93 = (float)((uint)((byte)(uVar34 >> 3) & 1) * auVar39._12_4_);
              auVar59._0_4_ = fVar95 * auVar36._0_4_;
              auVar59._4_4_ = fVar90 * auVar36._4_4_;
              auVar59._8_4_ = fVar94 * auVar36._8_4_;
              auVar59._12_4_ = fVar93 * auVar36._12_4_;
              local_1898 = vminps_avx512vl(auVar59,auVar78);
              auVar36._0_4_ = fVar95 * auVar41._0_4_;
              auVar36._4_4_ = fVar90 * auVar41._4_4_;
              auVar36._8_4_ = fVar94 * auVar41._8_4_;
              auVar36._12_4_ = fVar93 * auVar41._12_4_;
              local_1888 = vminps_avx512vl(auVar36,auVar78);
              local_1868 = vpbroadcastd_avx512vl();
              local_1878 = vpbroadcastd_avx512vl();
              vpcmpeqd_avx2(ZEXT1632(local_1898),ZEXT1632(local_1898));
              uStack_1854 = context->user->instID[0];
              local_1858 = uStack_1854;
              uStack_1850 = uStack_1854;
              uStack_184c = uStack_1854;
              uStack_1848 = context->user->instPrimID[0];
              uStack_1844 = uStack_1848;
              uStack_1840 = uStack_1848;
              uStack_183c = uStack_1848;
              auVar36 = vblendmps_avx512vl(auVar38,auVar48);
              bVar33 = (bool)(bVar22 >> 1 & 1);
              bVar8 = (bool)(bVar22 >> 2 & 1);
              *(uint *)(local_1920 + 0x80) =
                   (uint)(bVar22 & 1) * auVar36._0_4_ | !(bool)(bVar22 & 1) * uStack_1848;
              *(uint *)(local_1920 + 0x84) = (uint)bVar33 * auVar36._4_4_ | !bVar33 * uStack_1848;
              *(uint *)(local_1920 + 0x88) = (uint)bVar8 * auVar36._8_4_ | !bVar8 * uStack_1848;
              *(uint *)(local_1920 + 0x8c) =
                   (uint)(bVar22 >> 3) * auVar36._12_4_ | !(bool)(bVar22 >> 3) * uStack_1848;
              local_1938 = vpmovm2d_avx512vl((ulong)bVar22);
              args.valid = (int *)local_1938;
              args.geometryUserPtr = pGVar6->userPtr;
              args.context = context->user;
              args.ray = (RTCRayN *)local_1920;
              args.hit = local_18c8;
              args.N = 4;
              local_18c8 = (RTCHitN  [16])auVar47;
              local_18b8 = auVar50;
              local_18a8 = auVar51;
              if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar6->occlusionFilterN)(&args);
                auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar100 = ZEXT1664(auVar36);
                auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar101 = ZEXT1664(auVar36);
                auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar107 = ZEXT1664(auVar36);
                auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar106 = ZEXT1664(auVar36);
                auVar36 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                auVar105 = ZEXT1664(auVar36);
                auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar104 = ZEXT1664(auVar36);
                auVar36 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                auVar103 = ZEXT1664(auVar36);
                auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar102 = ZEXT1664(auVar36);
              }
              uVar34 = vptestmd_avx512vl(local_1938,local_1938);
              uVar34 = uVar34 & 0xf;
              if ((char)uVar34 != '\0') {
                p_Var7 = context->args->filter;
                if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var7)(&args);
                  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar100 = ZEXT1664(auVar36);
                  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar101 = ZEXT1664(auVar36);
                  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar107 = ZEXT1664(auVar36);
                  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar106 = ZEXT1664(auVar36);
                  auVar36 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  auVar105 = ZEXT1664(auVar36);
                  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar104 = ZEXT1664(auVar36);
                  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                  auVar103 = ZEXT1664(auVar36);
                  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar102 = ZEXT1664(auVar36);
                }
                uVar34 = vptestmd_avx512vl(local_1938,local_1938);
                uVar34 = uVar34 & 0xf;
                auVar36 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar33 = (bool)((byte)uVar34 & 1);
                auVar53._0_4_ =
                     (uint)bVar33 * auVar36._0_4_ | (uint)!bVar33 * *(int *)(args.ray + 0x80);
                bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
                auVar53._4_4_ =
                     (uint)bVar33 * auVar36._4_4_ | (uint)!bVar33 * *(int *)(args.ray + 0x84);
                bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
                auVar53._8_4_ =
                     (uint)bVar33 * auVar36._8_4_ | (uint)!bVar33 * *(int *)(args.ray + 0x88);
                bVar33 = SUB81(uVar34 >> 3,0);
                auVar53._12_4_ =
                     (uint)bVar33 * auVar36._12_4_ | (uint)!bVar33 * *(int *)(args.ray + 0x8c);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar53;
              }
              bVar33 = (bool)((byte)uVar34 & 1);
              auVar54._0_4_ = (uint)bVar33 * *(int *)local_1928 | (uint)!bVar33 * auVar38._0_4_;
              bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
              auVar54._4_4_ =
                   (uint)bVar33 * *(int *)(local_1928 + 4) | (uint)!bVar33 * auVar38._4_4_;
              bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
              auVar54._8_4_ =
                   (uint)bVar33 * *(int *)(local_1928 + 8) | (uint)!bVar33 * auVar38._8_4_;
              bVar33 = SUB81(uVar34 >> 3,0);
              auVar54._12_4_ =
                   (uint)bVar33 * *(int *)(local_1928 + 0xc) | (uint)!bVar33 * auVar38._12_4_;
              *(undefined1 (*) [16])local_1928 = auVar54;
            }
            bVar23 = ((byte)uVar34 ^ 0xf) & bVar23;
            ray = local_1920;
          }
        }
      }
      if (bVar23 == 0) {
        bVar33 = false;
      }
      else {
        auVar36 = *(undefined1 (*) [16])ray;
        auVar41 = *(undefined1 (*) [16])(ray + 0x10);
        auVar38 = *(undefined1 (*) [16])(ray + 0x20);
        auVar39 = *(undefined1 (*) [16])(ray + 0x40);
        auVar67 = *(undefined1 (*) [16])(ray + 0x50);
        auVar64 = *(undefined1 (*) [16])(ray + 0x60);
        auVar78 = vsubps_avx(auVar45,auVar36);
        auVar37 = vsubps_avx(auVar37,auVar41);
        auVar40 = vsubps_avx(auVar40,auVar38);
        auVar58 = vsubps_avx(auVar42,auVar36);
        auVar59 = vsubps_avx(auVar43,auVar41);
        auVar42 = vsubps_avx512vl(auVar44,auVar38);
        auVar43 = vsubps_avx512vl(auVar97,auVar36);
        auVar41 = vsubps_avx512vl(auVar98,auVar41);
        auVar38 = vsubps_avx512vl(auVar99,auVar38);
        auVar44 = vsubps_avx512vl(auVar43,auVar78);
        auVar45 = vsubps_avx512vl(auVar41,auVar37);
        auVar46 = vsubps_avx512vl(auVar38,auVar40);
        auVar47 = vsubps_avx512vl(auVar78,auVar58);
        auVar48 = vsubps_avx512vl(auVar37,auVar59);
        auVar49 = vsubps_avx512vl(auVar40,auVar42);
        auVar50 = vsubps_avx512vl(auVar58,auVar43);
        auVar51 = vsubps_avx512vl(auVar59,auVar41);
        auVar52 = vsubps_avx512vl(auVar42,auVar38);
        auVar36 = vaddps_avx512vl(auVar43,auVar78);
        auVar53 = vaddps_avx512vl(auVar41,auVar37);
        auVar54 = vaddps_avx512vl(auVar38,auVar40);
        auVar55 = vmulps_avx512vl(auVar53,auVar46);
        auVar55 = vfmsub231ps_avx512vl(auVar55,auVar45,auVar54);
        auVar54 = vmulps_avx512vl(auVar54,auVar44);
        auVar54 = vfmsub231ps_avx512vl(auVar54,auVar46,auVar36);
        auVar63._0_4_ = auVar45._0_4_ * auVar36._0_4_;
        auVar63._4_4_ = auVar45._4_4_ * auVar36._4_4_;
        auVar63._8_4_ = auVar45._8_4_ * auVar36._8_4_;
        auVar63._12_4_ = auVar45._12_4_ * auVar36._12_4_;
        auVar36 = vfmsub231ps_fma(auVar63,auVar44,auVar53);
        fVar90 = auVar64._0_4_;
        auVar80._0_4_ = fVar90 * auVar36._0_4_;
        fVar93 = auVar64._4_4_;
        auVar80._4_4_ = fVar93 * auVar36._4_4_;
        fVar94 = auVar64._8_4_;
        auVar80._8_4_ = fVar94 * auVar36._8_4_;
        fVar95 = auVar64._12_4_;
        auVar80._12_4_ = fVar95 * auVar36._12_4_;
        auVar36 = vfmadd231ps_avx512vl(auVar80,auVar67,auVar54);
        auVar53 = vfmadd231ps_avx512vl(auVar36,auVar39,auVar55);
        auVar82._0_4_ = auVar58._0_4_ + auVar78._0_4_;
        auVar82._4_4_ = auVar58._4_4_ + auVar78._4_4_;
        auVar82._8_4_ = auVar58._8_4_ + auVar78._8_4_;
        auVar82._12_4_ = auVar58._12_4_ + auVar78._12_4_;
        auVar36 = vaddps_avx512vl(auVar37,auVar59);
        auVar54 = vaddps_avx512vl(auVar40,auVar42);
        auVar55 = vmulps_avx512vl(auVar36,auVar49);
        auVar55 = vfmsub231ps_avx512vl(auVar55,auVar48,auVar54);
        auVar54 = vmulps_avx512vl(auVar54,auVar47);
        auVar54 = vfmsub231ps_avx512vl(auVar54,auVar49,auVar82);
        auVar56 = vmulps_avx512vl(auVar82,auVar48);
        auVar36 = vfmsub231ps_avx512vl(auVar56,auVar47,auVar36);
        auVar83._0_4_ = fVar90 * auVar36._0_4_;
        auVar83._4_4_ = fVar93 * auVar36._4_4_;
        auVar83._8_4_ = fVar94 * auVar36._8_4_;
        auVar83._12_4_ = fVar95 * auVar36._12_4_;
        auVar36 = vfmadd231ps_avx512vl(auVar83,auVar67,auVar54);
        auVar54 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar100 = ZEXT1664(auVar54);
        auVar55 = vfmadd231ps_avx512vl(auVar36,auVar39,auVar55);
        auVar36 = vaddps_avx512vl(auVar58,auVar43);
        auVar41 = vaddps_avx512vl(auVar59,auVar41);
        auVar38 = vaddps_avx512vl(auVar42,auVar38);
        auVar58 = vmulps_avx512vl(auVar41,auVar52);
        auVar58 = vfmsub231ps_avx512vl(auVar58,auVar51,auVar38);
        auVar38 = vmulps_avx512vl(auVar38,auVar50);
        auVar38 = vfmsub231ps_avx512vl(auVar38,auVar52,auVar36);
        auVar43._0_4_ = auVar36._0_4_ * auVar51._0_4_;
        auVar43._4_4_ = auVar36._4_4_ * auVar51._4_4_;
        auVar43._8_4_ = auVar36._8_4_ * auVar51._8_4_;
        auVar43._12_4_ = auVar36._12_4_ * auVar51._12_4_;
        auVar36 = vfmsub231ps_fma(auVar43,auVar50,auVar41);
        auVar36 = vmulps_avx512vl(auVar36,auVar64);
        auVar36 = vfmadd231ps_avx512vl(auVar36,auVar67,auVar38);
        auVar36 = vfmadd231ps_avx512vl(auVar36,auVar39,auVar58);
        auVar96._0_4_ = auVar53._0_4_ + auVar55._0_4_;
        auVar96._4_4_ = auVar53._4_4_ + auVar55._4_4_;
        auVar96._8_4_ = auVar53._8_4_ + auVar55._8_4_;
        auVar96._12_4_ = auVar53._12_4_ + auVar55._12_4_;
        auVar41 = vaddps_avx512vl(auVar36,auVar96);
        auVar43 = auVar102._0_16_;
        auVar38 = vandps_avx512vl(auVar41,auVar43);
        auVar42._8_4_ = 0x34000000;
        auVar42._0_8_ = 0x3400000034000000;
        auVar42._12_4_ = 0x34000000;
        auVar64 = vmulps_avx512vl(auVar38,auVar42);
        auVar58 = vminps_avx512vl(auVar53,auVar55);
        auVar58 = vminps_avx512vl(auVar58,auVar36);
        auVar59 = vxorps_avx512vl(auVar64,auVar54);
        uVar11 = vcmpps_avx512vl(auVar58,auVar59,5);
        auVar58 = vmaxps_avx512vl(auVar53,auVar55);
        auVar36 = vmaxps_avx512vl(auVar58,auVar36);
        uVar12 = vcmpps_avx512vl(auVar36,auVar64,2);
        bVar22 = ((byte)uVar11 | (byte)uVar12) & 0xf & bVar23;
        if (bVar22 == 0) {
          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar101 = ZEXT1664(auVar36);
        }
        else {
          auVar36 = vmulps_avx512vl(auVar48,auVar46);
          auVar64 = vmulps_avx512vl(auVar44,auVar49);
          auVar58 = vmulps_avx512vl(auVar47,auVar45);
          auVar59 = vmulps_avx512vl(auVar51,auVar49);
          auVar42 = vmulps_avx512vl(auVar47,auVar52);
          auVar54 = vmulps_avx512vl(auVar50,auVar48);
          auVar45 = vfmsub213ps_avx512vl(auVar45,auVar49,auVar36);
          auVar46 = vfmsub213ps_avx512vl(auVar46,auVar47,auVar64);
          auVar44 = vfmsub213ps_avx512vl(auVar44,auVar48,auVar58);
          auVar48 = vfmsub213ps_avx512vl(auVar52,auVar48,auVar59);
          auVar49 = vfmsub213ps_avx512vl(auVar50,auVar49,auVar42);
          auVar47 = vfmsub213ps_avx512vl(auVar51,auVar47,auVar54);
          auVar36 = vandps_avx512vl(auVar36,auVar43);
          auVar59 = vandps_avx512vl(auVar59,auVar43);
          uVar34 = vcmpps_avx512vl(auVar36,auVar59,1);
          auVar36 = vandps_avx512vl(auVar64,auVar43);
          auVar64 = vandps_avx512vl(auVar42,auVar43);
          uVar27 = vcmpps_avx512vl(auVar36,auVar64,1);
          auVar36 = vandps_avx512vl(auVar58,auVar43);
          auVar64 = vandps_avx512vl(auVar54,auVar43);
          auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar100 = ZEXT1664(auVar58);
          uVar13 = vcmpps_avx512vl(auVar36,auVar64,1);
          bVar33 = (bool)((byte)uVar34 & 1);
          auVar65._0_4_ = (uint)bVar33 * auVar45._0_4_ | (uint)!bVar33 * auVar48._0_4_;
          bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
          auVar65._4_4_ = (uint)bVar33 * auVar45._4_4_ | (uint)!bVar33 * auVar48._4_4_;
          bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
          auVar65._8_4_ = (uint)bVar33 * auVar45._8_4_ | (uint)!bVar33 * auVar48._8_4_;
          bVar33 = (bool)((byte)(uVar34 >> 3) & 1);
          auVar65._12_4_ = (uint)bVar33 * auVar45._12_4_ | (uint)!bVar33 * auVar48._12_4_;
          bVar33 = (bool)((byte)uVar27 & 1);
          auVar45._0_4_ = (uint)bVar33 * auVar46._0_4_ | (uint)!bVar33 * auVar49._0_4_;
          bVar33 = (bool)((byte)(uVar27 >> 1) & 1);
          auVar45._4_4_ = (uint)bVar33 * auVar46._4_4_ | (uint)!bVar33 * auVar49._4_4_;
          bVar33 = (bool)((byte)(uVar27 >> 2) & 1);
          auVar45._8_4_ = (uint)bVar33 * auVar46._8_4_ | (uint)!bVar33 * auVar49._8_4_;
          bVar33 = (bool)((byte)(uVar27 >> 3) & 1);
          auVar45._12_4_ = (uint)bVar33 * auVar46._12_4_ | (uint)!bVar33 * auVar49._12_4_;
          bVar33 = (bool)((byte)uVar13 & 1);
          auVar66._0_4_ = (float)((uint)bVar33 * auVar44._0_4_ | (uint)!bVar33 * auVar47._0_4_);
          bVar33 = (bool)((byte)(uVar13 >> 1) & 1);
          auVar66._4_4_ = (float)((uint)bVar33 * auVar44._4_4_ | (uint)!bVar33 * auVar47._4_4_);
          bVar33 = (bool)((byte)(uVar13 >> 2) & 1);
          auVar66._8_4_ = (float)((uint)bVar33 * auVar44._8_4_ | (uint)!bVar33 * auVar47._8_4_);
          bVar33 = (bool)((byte)(uVar13 >> 3) & 1);
          auVar66._12_4_ = (float)((uint)bVar33 * auVar44._12_4_ | (uint)!bVar33 * auVar47._12_4_);
          auVar91._0_4_ = fVar90 * auVar66._0_4_;
          auVar91._4_4_ = fVar93 * auVar66._4_4_;
          auVar91._8_4_ = fVar94 * auVar66._8_4_;
          auVar91._12_4_ = fVar95 * auVar66._12_4_;
          auVar36 = vfmadd213ps_fma(auVar67,auVar45,auVar91);
          auVar36 = vfmadd213ps_fma(auVar39,auVar65,auVar36);
          auVar87._0_4_ = auVar36._0_4_ + auVar36._0_4_;
          auVar87._4_4_ = auVar36._4_4_ + auVar36._4_4_;
          auVar87._8_4_ = auVar36._8_4_ + auVar36._8_4_;
          auVar87._12_4_ = auVar36._12_4_ + auVar36._12_4_;
          auVar88._0_4_ = auVar40._0_4_ * auVar66._0_4_;
          auVar88._4_4_ = auVar40._4_4_ * auVar66._4_4_;
          auVar88._8_4_ = auVar40._8_4_ * auVar66._8_4_;
          auVar88._12_4_ = auVar40._12_4_ * auVar66._12_4_;
          auVar36 = vfmadd213ps_fma(auVar37,auVar45,auVar88);
          auVar39 = vfmadd213ps_fma(auVar78,auVar65,auVar36);
          auVar36 = vrcp14ps_avx512vl(auVar87);
          auVar40 = vxorps_avx512vl(auVar87,auVar58);
          auVar67 = auVar104._0_16_;
          auVar37 = vfnmadd213ps_avx512vl(auVar36,auVar87,auVar67);
          auVar37 = vfmadd132ps_fma(auVar37,auVar36,auVar36);
          auVar36 = *(undefined1 (*) [16])(ray + 0x80);
          auVar44._0_4_ = auVar37._0_4_ * (auVar39._0_4_ + auVar39._0_4_);
          auVar44._4_4_ = auVar37._4_4_ * (auVar39._4_4_ + auVar39._4_4_);
          auVar44._8_4_ = auVar37._8_4_ * (auVar39._8_4_ + auVar39._8_4_);
          auVar44._12_4_ = auVar37._12_4_ * (auVar39._12_4_ + auVar39._12_4_);
          uVar11 = vcmpps_avx512vl(auVar44,auVar36,2);
          uVar12 = vcmpps_avx512vl(auVar44,*(undefined1 (*) [16])(ray + 0x30),0xd);
          uVar14 = vcmpps_avx512vl(auVar87,auVar40,4);
          bVar22 = bVar22 & (byte)uVar11 & (byte)uVar12 & (byte)uVar14;
          auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar101 = ZEXT1664(auVar37);
          if (bVar22 != 0) {
            pGVar6 = (context->scene->geometries).items[*(uint *)(lVar25 + -0x10 + uVar32 * 4)].ptr;
            uVar2 = pGVar6->mask;
            auVar40._4_4_ = uVar2;
            auVar40._0_4_ = uVar2;
            auVar40._8_4_ = uVar2;
            auVar40._12_4_ = uVar2;
            uVar11 = vptestmd_avx512vl(auVar40,*(undefined1 (*) [16])(ray + 0x90));
            bVar22 = bVar22 & (byte)uVar11 & 0xf;
            if (bVar22 != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                uVar34 = vcmpps_avx512vl(auVar38,auVar103._0_16_,5);
                auVar37 = vrcp14ps_avx512vl(auVar41);
                auVar41 = vfnmadd213ps_avx512vl(auVar41,auVar37,auVar67);
                auVar41 = vfmadd132ps_avx512vl(auVar41,auVar37,auVar37);
                fVar95 = (float)((uint)((byte)uVar34 & 1) * auVar41._0_4_);
                fVar94 = (float)((uint)((byte)(uVar34 >> 1) & 1) * auVar41._4_4_);
                fVar93 = (float)((uint)((byte)(uVar34 >> 2) & 1) * auVar41._8_4_);
                fVar90 = (float)((uint)((byte)(uVar34 >> 3) & 1) * auVar41._12_4_);
                auVar81._0_4_ = fVar95 * auVar53._0_4_;
                auVar81._4_4_ = fVar94 * auVar53._4_4_;
                auVar81._8_4_ = fVar93 * auVar53._8_4_;
                auVar81._12_4_ = fVar90 * auVar53._12_4_;
                auVar41 = vminps_avx512vl(auVar81,auVar67);
                auVar84._0_4_ = fVar95 * auVar55._0_4_;
                auVar84._4_4_ = fVar94 * auVar55._4_4_;
                auVar84._8_4_ = fVar93 * auVar55._8_4_;
                auVar84._12_4_ = fVar90 * auVar55._12_4_;
                auVar37 = vminps_avx512vl(auVar84,auVar67);
                local_1898 = vsubps_avx512vl(auVar67,auVar41);
                local_1888 = vsubps_avx512vl(auVar67,auVar37);
                local_1868 = vpbroadcastd_avx512vl();
                local_1878 = vpbroadcastd_avx512vl();
                vpcmpeqd_avx2(ZEXT1632(auVar45),ZEXT1632(auVar45));
                uStack_1854 = context->user->instID[0];
                local_1858 = uStack_1854;
                uStack_1850 = uStack_1854;
                uStack_184c = uStack_1854;
                uStack_1848 = context->user->instPrimID[0];
                uStack_1844 = uStack_1848;
                uStack_1840 = uStack_1848;
                uStack_183c = uStack_1848;
                auVar41 = vblendmps_avx512vl(auVar36,auVar44);
                bVar33 = (bool)(bVar22 >> 1 & 1);
                bVar8 = (bool)(bVar22 >> 2 & 1);
                *(uint *)(ray + 0x80) =
                     (uint)(bVar22 & 1) * auVar41._0_4_ | !(bool)(bVar22 & 1) * uStack_1848;
                *(uint *)(ray + 0x84) = (uint)bVar33 * auVar41._4_4_ | !bVar33 * uStack_1848;
                *(uint *)(ray + 0x88) = (uint)bVar8 * auVar41._8_4_ | !bVar8 * uStack_1848;
                *(uint *)(ray + 0x8c) =
                     (uint)(bVar22 >> 3) * auVar41._12_4_ | !(bool)(bVar22 >> 3) * uStack_1848;
                local_1938 = vpmovm2d_avx512vl((ulong)bVar22);
                args.valid = (int *)local_1938;
                args.geometryUserPtr = pGVar6->userPtr;
                args.context = context->user;
                args.hit = local_18c8;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                local_18c8 = (RTCHitN  [16])auVar65;
                local_18b8 = auVar45;
                local_18a8 = auVar66;
                if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar6->occlusionFilterN)(&args);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar100 = ZEXT1664(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar101 = ZEXT1664(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar107 = ZEXT1664(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar106 = ZEXT1664(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  auVar105 = ZEXT1664(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar104 = ZEXT1664(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                  auVar103 = ZEXT1664(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar102 = ZEXT1664(auVar41);
                }
                uVar34 = vptestmd_avx512vl(local_1938,local_1938);
                uVar34 = uVar34 & 0xf;
                if ((char)uVar34 != '\0') {
                  p_Var7 = context->args->filter;
                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var7)(&args);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar100 = ZEXT1664(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                    auVar101 = ZEXT1664(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                    auVar107 = ZEXT1664(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar106 = ZEXT1664(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    auVar105 = ZEXT1664(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar104 = ZEXT1664(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                    auVar103 = ZEXT1664(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar102 = ZEXT1664(auVar41);
                  }
                  uVar34 = vptestmd_avx512vl(local_1938,local_1938);
                  uVar34 = uVar34 & 0xf;
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar33 = (bool)((byte)uVar34 & 1);
                  auVar68._0_4_ =
                       (uint)bVar33 * auVar41._0_4_ | (uint)!bVar33 * *(int *)(args.ray + 0x80);
                  bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
                  auVar68._4_4_ =
                       (uint)bVar33 * auVar41._4_4_ | (uint)!bVar33 * *(int *)(args.ray + 0x84);
                  bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
                  auVar68._8_4_ =
                       (uint)bVar33 * auVar41._8_4_ | (uint)!bVar33 * *(int *)(args.ray + 0x88);
                  bVar33 = SUB81(uVar34 >> 3,0);
                  auVar68._12_4_ =
                       (uint)bVar33 * auVar41._12_4_ | (uint)!bVar33 * *(int *)(args.ray + 0x8c);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar68;
                }
                bVar22 = (byte)uVar34;
                auVar69._0_4_ =
                     (uint)(bVar22 & 1) * *(int *)local_1928 |
                     (uint)!(bool)(bVar22 & 1) * auVar36._0_4_;
                bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
                auVar69._4_4_ =
                     (uint)bVar33 * *(int *)(local_1928 + 4) | (uint)!bVar33 * auVar36._4_4_;
                bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
                auVar69._8_4_ =
                     (uint)bVar33 * *(int *)(local_1928 + 8) | (uint)!bVar33 * auVar36._8_4_;
                bVar33 = SUB81(uVar34 >> 3,0);
                auVar69._12_4_ =
                     (uint)bVar33 * *(int *)(local_1928 + 0xc) | (uint)!bVar33 * auVar36._12_4_;
                *(undefined1 (*) [16])local_1928 = auVar69;
              }
              bVar23 = (bVar22 ^ 0xf) & bVar23;
            }
          }
        }
        bVar33 = bVar23 != 0;
      }
      if ((!bVar33) || (bVar33 = 2 < uVar32, uVar32 = uVar32 + 1, bVar33)) break;
    }
    bVar18 = bVar18 & bVar23;
    if (bVar18 == 0) break;
  }
  bVar18 = bVar18 ^ 0xf;
LAB_0073ff78:
  bVar18 = (byte)uVar21 | bVar18;
  uVar21 = (ushort)bVar18;
  if (bVar18 == 0xf) {
LAB_0073ff88:
    iVar20 = 3;
  }
  else {
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    tray.tfar.field_0.i[0] =
         (uint)(bVar18 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar18 & 1) * tray.tfar.field_0.i[0];
    bVar33 = (bool)(bVar18 >> 1 & 1);
    tray.tfar.field_0.i[1] = (uint)bVar33 * auVar36._4_4_ | (uint)!bVar33 * tray.tfar.field_0.i[1];
    bVar33 = (bool)(bVar18 >> 2 & 1);
    tray.tfar.field_0.i[2] = (uint)bVar33 * auVar36._8_4_ | (uint)!bVar33 * tray.tfar.field_0.i[2];
    bVar33 = (bool)(bVar18 >> 3 & 1);
    tray.tfar.field_0.i[3] = (uint)bVar33 * auVar36._12_4_ | (uint)!bVar33 * tray.tfar.field_0.i[3];
    iVar20 = 0;
  }
LAB_0073ffaf:
  if (iVar20 == 3) {
    bVar19 = (byte)uVar21 & bVar19;
    bVar33 = (bool)(bVar19 >> 1 & 1);
    bVar8 = (bool)(bVar19 >> 2 & 1);
    *(uint *)local_1928 =
         (uint)(bVar19 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar19 & 1) * *(int *)local_1928;
    *(uint *)(local_1928 + 4) =
         (uint)bVar33 * auVar105._4_4_ | (uint)!bVar33 * *(int *)(local_1928 + 4);
    *(uint *)(local_1928 + 8) =
         (uint)bVar8 * auVar105._8_4_ | (uint)!bVar8 * *(int *)(local_1928 + 8);
    *(uint *)(local_1928 + 0xc) =
         (uint)(bVar19 >> 3) * auVar105._12_4_ |
         (uint)!(bool)(bVar19 >> 3) * *(int *)(local_1928 + 0xc);
    return;
  }
  goto LAB_0073efcb;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }